

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_xmlns(lyout *out,lys_module *module)

{
  lys_module *plVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (*(ushort *)&module->field_0x40 & 1) * 3 + 8;
  ly_print(out,"%*sxmlns=\"%s\"",(ulong)uVar4,"","urn:ietf:params:xml:ns:yang:yin:1");
  plVar1 = module;
  if ((module->field_0x40 & 1) != 0) {
    plVar1 = (lys_module *)module->data;
  }
  ly_print(out,"\n%*sxmlns:%s=\"%s\"",(ulong)uVar4,"",module->prefix,plVar1->ns);
  if (module->imp_size != '\0') {
    lVar2 = 8;
    uVar3 = 0;
    do {
      ly_print(out,"\n%*sxmlns:%s=\"%s\"",(ulong)uVar4,"",
               *(undefined8 *)(module->imp->rev + lVar2 + -0x10),
               *(undefined8 *)(*(long *)(module->imp->rev + lVar2 + -0x18) + 0xb0));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar3 < module->imp_size);
  }
  return;
}

Assistant:

static void
yin_print_xmlns(struct lyout *out, const struct lys_module *module)
{
    unsigned int i, lvl;

    if (module->type) {
        lvl = 11;
    } else {
        lvl = 8;
    }

    ly_print(out, "%*sxmlns=\"%s\"", lvl, INDENT, LY_NSYIN);
    if (!module->type) {
        ly_print(out, "\n%*sxmlns:%s=\"%s\"", lvl, INDENT, module->prefix, module->ns);
    } else {
        ly_print(out, "\n%*sxmlns:%s=\"%s\"", lvl, INDENT, module->prefix, ((struct lys_submodule*)module)->belongsto->ns);
    }
    for (i = 0; i < module->imp_size; ++i) {
        ly_print(out, "\n%*sxmlns:%s=\"%s\"", lvl, INDENT, module->imp[i].prefix, module->imp[i].module->ns);
    }
}